

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O1

size_t __thiscall SignerInfo::SetDataSize(SignerInfo *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  uVar1 = (this->version).super_DerBase.cbData;
  lVar11 = 2;
  lVar9 = 2;
  if ((((0x7f < uVar1) && (lVar9 = 3, 0xff < uVar1)) && (lVar9 = 4, 0xffff < uVar1)) &&
     (((lVar9 = 5, 0xffffff < uVar1 && (lVar9 = 6, uVar1 >> 0x20 != 0)) &&
      (lVar9 = 7, uVar1 >> 0x28 != 0)))) {
    lVar9 = (ulong)(uVar1 >> 0x30 == 0) << 3;
  }
  uVar2 = (this->sid).super_ChoiceType.super_DerBase.cbData;
  if (((0x7f < uVar2) && (lVar11 = 3, 0xff < uVar2)) &&
     ((lVar11 = 4, 0xffff < uVar2 &&
      (((lVar11 = 5, 0xffffff < uVar2 && (lVar11 = 6, uVar2 >> 0x20 != 0)) &&
       (lVar11 = 7, uVar2 >> 0x28 != 0)))))) {
    lVar11 = (ulong)(uVar2 >> 0x30 == 0) << 3;
  }
  uVar3 = (this->digestAlgorithm).super_DerBase.cbData;
  lVar12 = 2;
  lVar8 = 2;
  if ((((0x7f < uVar3) && (lVar8 = 3, 0xff < uVar3)) &&
      ((lVar8 = 4, 0xffff < uVar3 &&
       ((lVar8 = 5, 0xffffff < uVar3 && (lVar8 = 6, uVar3 >> 0x20 != 0)))))) &&
     (lVar8 = 7, uVar3 >> 0x28 != 0)) {
    lVar8 = (ulong)(uVar3 >> 0x30 == 0) << 3;
  }
  sVar6 = GetDataSize<Attribute>(&this->signedAttrs);
  uVar4 = (this->signatureAlgorithm).super_DerBase.cbData;
  if (((((0x7f < uVar4) && (lVar12 = 3, 0xff < uVar4)) && (lVar12 = 4, 0xffff < uVar4)) &&
      ((lVar12 = 5, 0xffffff < uVar4 && (lVar12 = 6, uVar4 >> 0x20 != 0)))) &&
     (lVar12 = 7, uVar4 >> 0x28 != 0)) {
    lVar12 = (ulong)(uVar4 >> 0x30 == 0) << 3;
  }
  uVar5 = (this->signature).super_DerBase.cbData;
  lVar10 = 2;
  if (((0x7f < uVar5) && (lVar10 = 3, 0xff < uVar5)) &&
     ((lVar10 = 4, 0xffff < uVar5 &&
      (((lVar10 = 5, 0xffffff < uVar5 && (lVar10 = 6, uVar5 >> 0x20 != 0)) &&
       (lVar10 = 7, uVar5 >> 0x28 != 0)))))) {
    lVar10 = (ulong)(uVar5 >> 0x30 == 0) << 3;
  }
  if (sVar6 == 0) {
    sVar6 = 2;
  }
  sVar7 = GetDataSize<Attribute>(&this->unsignedAttrs);
  if (sVar7 == 0) {
    sVar7 = 2;
  }
  sVar7 = sVar7 + sVar6 + lVar12 + uVar5 + lVar10 +
                  uVar3 + lVar8 + uVar4 + uVar2 + lVar11 + lVar9 + uVar1;
  (this->super_DerBase).cbData = sVar7;
  return sVar7;
}

Assistant:

virtual size_t SetDataSize() override
	{
		return	(
				cbData =
				version.EncodedSize() +
				sid.EncodedSize() +
				digestAlgorithm.EncodedSize() +
				GetEncodedSize(signedAttrs) +
				signatureAlgorithm.EncodedSize() +
				signature.EncodedSize() +
				GetEncodedSize(unsignedAttrs)
				);
	}